

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t *
Abc_NtkCreateNodeMux(Abc_Ntk_t *pNtk,Abc_Obj_t *pNodeC,Abc_Obj_t *pNode1,Abc_Obj_t *pNode0)

{
  DdManager *dd;
  Hop_Man_t *p;
  int iVar1;
  Abc_Obj_t *pObj;
  char *pcVar2;
  DdNode *pDVar3;
  DdNode *g;
  DdNode *h;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *p1;
  Hop_Obj_t *p0;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNode0_local;
  Abc_Obj_t *pNode1_local;
  Abc_Obj_t *pNodeC_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x344,
                  "Abc_Obj_t *Abc_NtkCreateNodeMux(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)"
                 );
  }
  pObj = Abc_NtkCreateNode(pNtk);
  Abc_ObjAddFanin(pObj,pNodeC);
  Abc_ObjAddFanin(pObj,pNode1);
  Abc_ObjAddFanin(pObj,pNode0);
  iVar1 = Abc_NtkHasSop(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasBdd(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasAig(pNtk);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                      ,0x352,
                      "Abc_Obj_t *Abc_NtkCreateNodeMux(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)"
                     );
      }
      p = (Hop_Man_t *)pNtk->pManFunc;
      pHVar4 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,0);
      p1 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,1);
      p0 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,2);
      pHVar4 = Hop_Mux(p,pHVar4,p1,p0);
      (pObj->field_5).pData = pHVar4;
    }
    else {
      dd = (DdManager *)pNtk->pManFunc;
      pDVar3 = Cudd_bddIthVar((DdManager *)pNtk->pManFunc,0);
      g = Cudd_bddIthVar((DdManager *)pNtk->pManFunc,1);
      h = Cudd_bddIthVar((DdManager *)pNtk->pManFunc,2);
      pDVar3 = Cudd_bddIte(dd,pDVar3,g,h);
      (pObj->field_5).pData = pDVar3;
      Cudd_Ref((DdNode *)(pObj->field_5).pData);
    }
  }
  else {
    pcVar2 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,"11- 1\n0-1 1\n");
    (pObj->field_5).pData = pcVar2;
  }
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateNodeMux( Abc_Ntk_t * pNtk, Abc_Obj_t * pNodeC, Abc_Obj_t * pNode1, Abc_Obj_t * pNode0 )
{
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsLogic(pNtk) );
    pNode = Abc_NtkCreateNode( pNtk );   
    Abc_ObjAddFanin( pNode, pNodeC );
    Abc_ObjAddFanin( pNode, pNode1 );
    Abc_ObjAddFanin( pNode, pNode0 );
    if ( Abc_NtkHasSop(pNtk) )
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, "11- 1\n0-1 1\n" );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNode->pData = Cudd_bddIte((DdManager *)pNtk->pManFunc,Cudd_bddIthVar((DdManager *)pNtk->pManFunc,0),Cudd_bddIthVar((DdManager *)pNtk->pManFunc,1),Cudd_bddIthVar((DdManager *)pNtk->pManFunc,2)), Cudd_Ref( (DdNode *)pNode->pData );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNode->pData = Hop_Mux((Hop_Man_t *)pNtk->pManFunc,Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,0),Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,1),Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,2));
    else
        assert( 0 );
    return pNode;
}